

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall CLIntercept::checkRemoveMemObj(CLIntercept *this,cl_mem memobj)

{
  cl_uint cVar1;
  cl_mem in_RDI;
  cl_uint refCount;
  lock_guard<std::mutex> lock;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
             ,(mutex_type *)in_RDI);
  cVar1 = getRefCount((CLIntercept *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_RDI);
  if (cVar1 == 1) {
    std::
    map<const_void_*,_unsigned_int,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
    ::erase((map<const_void_*,_unsigned_int,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
             *)CONCAT44(1,in_stack_ffffffffffffffc0),(key_type *)in_RDI);
    std::
    map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
    ::erase((map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
             *)CONCAT44(cVar1,in_stack_ffffffffffffffc0),(key_type *)in_RDI);
    std::
    map<_cl_mem_*,_CLIntercept::SImageInfo,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_CLIntercept::SImageInfo>_>_>
    ::erase((map<_cl_mem_*,_CLIntercept::SImageInfo,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_CLIntercept::SImageInfo>_>_>
             *)CONCAT44(cVar1,in_stack_ffffffffffffffc0),(key_type *)in_RDI);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x20b4ed);
  return;
}

Assistant:

void CLIntercept::checkRemoveMemObj(
    cl_mem memobj )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_uint refCount = getRefCount( memobj );
    if( refCount == 1 )
    {
        m_MemAllocNumberMap.erase( memobj );
        m_BufferInfoMap.erase( memobj );
        m_ImageInfoMap.erase( memobj );
    }
}